

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O1

char * readline(char *source,int *pointer)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = *pointer;
  __ptr = (void *)0x0;
  uVar5 = 0;
  do {
    cVar1 = source[uVar5 + (long)iVar2];
    iVar4 = (int)uVar5;
    if (cVar1 == '\n') {
LAB_001073cb:
      *pointer = *pointer + 1;
      pcVar3 = (char *)realloc(__ptr,(ulong)(iVar4 + 2));
      (pcVar3 + (uVar5 & 0xffffffff))[0] = '\n';
      (pcVar3 + (uVar5 & 0xffffffff))[1] = '\0';
      return pcVar3;
    }
    if (cVar1 == '\r') {
      *pointer = iVar2 + iVar4 + 1;
      goto LAB_001073cb;
    }
    __ptr = realloc(__ptr,uVar5 + 1);
    *(char *)((long)__ptr + uVar5) = cVar1;
    *pointer = iVar4 + iVar2 + 1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static char* readline(const char *source, int *pointer){
    char *line = NULL;
    int i = 0;
    while(!(source[*pointer] == '\r' || source[*pointer] == '\n')){
        i++;
        line = (char *)reallocate(line, sizeof(char) * i);
        line[i - 1] = source[*pointer];
        *pointer = *pointer + 1;
    }
    if(source[*pointer] == '\r')
        *pointer = *pointer + 1;
    *pointer = *pointer + 1;
    
    i += 2;
    line = (char *)reallocate(line, sizeof(char) * i);
    line[i - 1] = '\0';
    line[i - 2] = '\n';

    return line;
}